

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

LispPTR linkblock(LispPTR base)

{
  int iVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  LispPTR LVar5;
  uint LAddr;
  int iVar6;
  
  if (*FreeBlockBuckets_word != 0) {
    pLVar2 = NativeAligned4FromLAddr(base);
    LVar5 = 0;
    if (3 < (ushort)*pLVar2) {
      LVar5 = *FreeBlockBuckets_word;
      iVar1 = integerlength((uint)(ushort)*pLVar2);
      iVar6 = 0x3c;
      if (iVar1 < 0x1f) {
        iVar6 = iVar1 * 2;
      }
      pLVar3 = NativeAligned4FromLAddr(iVar6 + LVar5 & 0xfffffff);
      LAddr = *pLVar3 & 0xfffffff;
      if (LAddr == 0) {
        pLVar2[1] = base;
      }
      else {
        pLVar4 = NativeAligned4FromLAddr(LAddr);
        pLVar2[1] = LAddr;
        LVar5 = pLVar4[2];
        pLVar2[2] = LVar5;
        pLVar2 = NativeAligned4FromLAddr(LVar5);
        pLVar2[1] = base;
        pLVar2 = pLVar4;
      }
      pLVar2[2] = base;
      *pLVar3 = base;
      LVar5 = 1;
    }
    checkarrayblock(base,1,LVar5);
  }
  return base;
}

Assistant:

LispPTR linkblock(LispPTR base) {
  struct arrayblock *bbase, *fbbase, *tmpbase;
  LispPTR fbl, freeblocklsp;
  LispPTR *freeblock;
  if (*FreeBlockBuckets_word != NIL) {
    bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
    if (bbase->arlen < MINARRAYBLOCKSIZE)
      checkarrayblock(base, T, NIL);
    else {
      fbl = FreeBlockChainN(bbase->arlen);
      freeblock = (LispPTR *)NativeAligned4FromLAddr(POINTERMASK & fbl);
      freeblocklsp = POINTERMASK & (*freeblock);
      if (freeblocklsp == NIL) {
        bbase->fwd = base;
        bbase->bkwd = base;
      } else {
        fbbase = (struct arrayblock *)NativeAligned4FromLAddr(freeblocklsp);
        bbase->fwd = freeblocklsp;
        bbase->bkwd = fbbase->bkwd;
        tmpbase = (struct arrayblock *)NativeAligned4FromLAddr(fbbase->bkwd);
        tmpbase->fwd = base;
        fbbase->bkwd = base;
      }
      *freeblock = base;
      checkarrayblock(base, T, T);
    }
  }
  return (base);
}